

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

int __thiscall
TPZMatrix<TFad<6,_double>_>::Subst_Forward
          (TPZMatrix<TFad<6,_double>_> *this,TPZFMatrix<TFad<6,_double>_> *B)

{
  double dVar1;
  int iVar2;
  undefined4 extraout_var;
  int extraout_var_00;
  long lVar3;
  undefined4 extraout_var_01;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double local_140;
  double local_130 [8];
  undefined **local_f0;
  double local_e8;
  undefined **appuStack_e0 [7];
  undefined8 local_a8;
  undefined **appuStack_a0 [6];
  undefined1 local_70 [8];
  double local_68;
  double adStack_60 [6];
  
  lVar7 = (B->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.fRow;
  iVar2 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])();
  iVar4 = 0;
  if ((lVar7 == CONCAT44(extraout_var,iVar2)) && ((this->super_TPZBaseMatrix).fDecomposed == '\x03')
     ) {
    iVar2 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
    iVar4 = 1;
    if (CONCAT44(extraout_var_00,iVar2) != 0 && -1 < extraout_var_00) {
      lVar7 = 0;
      do {
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (local_70,this,lVar7,lVar7);
        if (0 < (B->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.fCol) {
          lVar5 = 0;
          do {
            appuStack_a0[3] = (undefined **)0x0;
            appuStack_a0[4] = (undefined **)0x0;
            appuStack_a0[1] = (undefined **)0x0;
            appuStack_a0[2] = (undefined **)0x0;
            local_a8 = 0;
            appuStack_a0[0] = (undefined **)0x0;
            appuStack_a0[5] = (undefined **)0x0;
            if (lVar7 == 0) {
              local_140 = 0.0;
            }
            else {
              local_140 = 0.0;
              lVar6 = 0;
              do {
                (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                          (&local_f0,this,lVar7,lVar6);
                (*(B->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.super_TPZSavable.
                  _vptr_TPZSavable[0x24])(local_130,B,lVar6,lVar5);
                lVar3 = 2;
                do {
                  dVar1 = local_130[lVar3 + 1];
                  appuStack_e0[lVar3 + 6] =
                       (undefined **)
                       ((double)appuStack_e0[lVar3 + 6] +
                       local_130[lVar3] * local_e8 + (double)(&local_f0)[lVar3] * local_130[1]);
                  appuStack_e0[lVar3 + 7] =
                       (undefined **)
                       ((double)appuStack_e0[lVar3 + 7] +
                       dVar1 * local_e8 + (double)appuStack_e0[lVar3 + -1] * local_130[1]);
                  lVar3 = lVar3 + 2;
                } while (lVar3 != 8);
                local_140 = local_140 + local_130[1] * local_e8;
                lVar6 = lVar6 + 1;
              } while (lVar6 != lVar7);
            }
            (*(B->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0x24])(local_130,B,lVar7,lVar5);
            local_f0 = &PTR__TFad_01835938;
            local_140 = local_130[1] - local_140;
            local_e8 = local_140 / local_68;
            lVar6 = 0;
            do {
              auVar8._0_8_ = (*(double *)((long)local_130 + lVar6 + 0x10) -
                             *(double *)((long)appuStack_a0 + lVar6)) * local_68 -
                             *(double *)((long)adStack_60 + lVar6) * local_140;
              auVar8._8_8_ = (*(double *)((long)local_130 + lVar6 + 0x18) -
                             *(double *)((long)appuStack_a0 + lVar6 + 8)) * local_68 -
                             *(double *)((long)adStack_60 + lVar6 + 8) * local_140;
              auVar9._8_8_ = local_68 * local_68;
              auVar9._0_8_ = local_68 * local_68;
              auVar9 = divpd(auVar8,auVar9);
              *(undefined1 (*) [16])((long)appuStack_e0 + lVar6) = auVar9;
              lVar6 = lVar6 + 0x10;
            } while (lVar6 != 0x30);
            (*(B->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0x23])(B,lVar7,lVar5,&local_f0);
            lVar5 = lVar5 + 1;
          } while (lVar5 < (B->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.fCol);
        }
        lVar7 = lVar7 + 1;
        iVar2 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
      } while (lVar7 < CONCAT44(extraout_var_01,iVar2));
      iVar4 = 1;
    }
  }
  return iVar4;
}

Assistant:

int TPZMatrix<TVar>::Subst_Forward( TPZFMatrix<TVar> *B ) const {
	if ( (B->Rows() != Dim()) || !fDecomposed || fDecomposed != ECholesky)
		return( 0 );
	for ( int64_t r = 0; r < Dim(); r++ ) {
		TVar pivot = GetVal( r, r );
		for ( int64_t c = 0; c < B->Cols();  c++ ) {
			// Faz sum = SOMA( A[r,i] * B[i,c] ); i = 0, ..., r-1.
			//
			TVar sum = 0.0;
			for ( int64_t i = 0; i < r; i++ ) sum += GetVal(r, i) * B->GetVal(i, c);
			
			// Faz B[r,c] = (B[r,c] - sum) / A[r,r].
			//
			B->PutVal( r, c, (B->GetVal(r, c) - sum) / pivot );
		}
	}
	return( 1 );
}